

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O3

void * UnionUnderlyingType::ABCUnion::UnPack(void *obj,ABC type,resolver_function_t *resolver)

{
  uint *puVar1;
  undefined4 uVar2;
  string *this;
  ulong uVar3;
  A *ptr;
  string sVar4;
  long *local_38 [2];
  long local_28 [2];
  
  if (type == C) {
    this = (string *)operator_new(1);
    if ((*(ushort *)((long)obj - (long)*obj) < 5) ||
       (uVar3 = (ulong)*(ushort *)((long)obj + (4 - (long)*obj)), uVar3 == 0)) {
      sVar4 = (string)0x0;
    }
    else {
      sVar4 = (string)(*(char *)((long)obj + uVar3) != '\0');
    }
    *this = sVar4;
  }
  else if (type == B) {
    this = (string *)operator_new(0x20);
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    *(string **)this = this + 0x10;
    *(undefined8 *)(this + 8) = 0;
    if ((4 < *(ushort *)((long)obj - (long)*obj)) &&
       (uVar3 = (ulong)*(ushort *)((long)obj + (4 - (long)*obj)), uVar3 != 0)) {
      puVar1 = (uint *)((long)obj + *(uint *)((long)obj + uVar3) + uVar3);
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,puVar1 + 1,
                 (long)obj + (ulong)*puVar1 + *(uint *)((long)obj + uVar3) + uVar3 + 4);
      std::__cxx11::string::operator=(this,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
  }
  else if (type == A) {
    this = (string *)operator_new(4);
    uVar2 = 0;
    if ((4 < *(ushort *)((long)obj - (long)*obj)) &&
       (uVar3 = (ulong)*(ushort *)((long)obj + (4 - (long)*obj)), uVar2 = 0, uVar3 != 0)) {
      uVar2 = *(undefined4 *)((long)obj + uVar3);
    }
    *(undefined4 *)this = uVar2;
  }
  else {
    this = (string *)0x0;
  }
  return this;
}

Assistant:

inline void *ABCUnion::UnPack(const void *obj, ABC type, const ::flatbuffers::resolver_function_t *resolver) {
  (void)resolver;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::A *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::B *>(obj);
      return ptr->UnPack(resolver);
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::C *>(obj);
      return ptr->UnPack(resolver);
    }
    default: return nullptr;
  }
}